

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order.cpp
# Opt level: O3

void __thiscall
haVoc::ScoredMoves::load_and_score
          (ScoredMoves *this,position *p,Movegen *moves,vector<Move,_std::allocator<Move>_> *filters
          ,Move *previous,Move *followup,Move *threat,node *stack,ScoreFunc *score_lambda)

{
  undefined1 uVar1;
  U8 UVar2;
  U8 UVar3;
  Score SVar4;
  pointer pSVar5;
  bool bVar6;
  U8 UVar7;
  int iVar8;
  Score SVar9;
  ulong uVar10;
  uint uVar11;
  pointer pMVar12;
  ulong uVar13;
  U8 *pUVar14;
  long lVar15;
  Move local_5b;
  ScoredMove local_58;
  ScoredMoves *local_50;
  position *local_48;
  Move *local_40;
  Move *local_38;
  
  this->m_start = 0;
  this->m_end = 0;
  iVar8 = moves->last;
  if (0 < iVar8) {
    pUVar14 = &moves->list[0].type;
    lVar15 = 0;
    local_50 = this;
    local_48 = p;
    local_40 = previous;
    local_38 = followup;
    do {
      local_5b.f = ((Move *)(pUVar14 + -2))->f;
      this = (ScoredMoves *)CONCAT71((int7)((ulong)this >> 8),local_5b.f);
      local_5b.t = pUVar14[-1];
      local_5b.type = *pUVar14;
      pMVar12 = (filters->super__Vector_base<Move,_std::allocator<Move>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((((((local_5b.f != pMVar12->f) || (local_5b.t != pMVar12->t)) ||
            (local_5b.type != pMVar12->type)) &&
           (((local_5b.f != pMVar12[1].f || (local_5b.t != pMVar12[1].t)) ||
            (local_5b.type != pMVar12[1].type)))) &&
          (((local_5b.f != pMVar12[2].f || (local_5b.t != pMVar12[2].t)) ||
           (local_5b.type != pMVar12[2].type)))) &&
         ((((local_5b.f != pMVar12[3].f || (local_5b.t != pMVar12[3].t)) ||
           (local_5b.type != pMVar12[3].type)) &&
          (((local_5b.f != pMVar12[4].f || (local_5b.t != pMVar12[4].t)) ||
           (local_5b.type != pMVar12[4].type)))))) {
        local_58 = (ScoredMove)stack;
        if ((score_lambda->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          pSVar5 = (this->m_moves).
                   super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar10 = (long)(this->m_moves).
                         super__Vector_base<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 3;
          uVar11 = this->m_start;
          if (uVar11 + 1 < (uint)uVar10) {
            uVar13 = (ulong)(uVar11 + 1);
            do {
              uVar1 = pSVar5[uVar13].m.f;
              UVar2 = pSVar5[uVar13].m.t;
              UVar3 = pSVar5[uVar13].m.type;
              SVar9 = pSVar5[uVar13].s;
              if (-1 < (int)uVar11) {
                do {
                  SVar4 = pSVar5[uVar11].s;
                  if (SVar9 <= SVar4) goto LAB_00118eb8;
                  pSVar5[(ulong)uVar11 + 1].m.f = pSVar5[uVar11].m.f;
                  UVar7 = pSVar5[uVar11].m.type;
                  pSVar5[(ulong)uVar11 + 1].m.t = pSVar5[uVar11].m.t;
                  pSVar5[(ulong)uVar11 + 1].m.type = UVar7;
                  pSVar5[(ulong)uVar11 + 1].s = SVar4;
                  bVar6 = 0 < (int)uVar11;
                  uVar11 = uVar11 - 1;
                } while (bVar6);
                uVar11 = 0xffffffff;
              }
LAB_00118eb8:
              lVar15 = (long)(int)uVar11;
              pSVar5[lVar15 + 1].m.f = uVar1;
              pSVar5[lVar15 + 1].m.t = UVar2;
              pSVar5[lVar15 + 1].m.type = UVar3;
              pSVar5[lVar15 + 1].s = SVar9;
              uVar11 = (uint)uVar13;
              uVar13 = uVar13 + 1;
            } while ((uint)uVar13 != (uint)uVar10);
          }
          uVar11 = this->m_end;
          this->m_start = uVar11;
          uVar13 = (ulong)(int)uVar11;
          if (uVar13 < uVar10) {
            SVar9 = *(Score *)pMVar12;
            do {
              if (SVar9 <= pSVar5[uVar13].s) {
                uVar11 = uVar11 + 1;
                this->m_end = uVar11;
              }
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
          return;
        }
        SVar9 = (*score_lambda->_M_invoker)
                          ((_Any_data *)score_lambda,local_48,&local_5b,local_40,local_38,threat,
                           (node **)&local_58);
        local_58.m.t = local_5b.t;
        local_58.m.type = local_5b.type;
        local_58.m.f = local_5b.f;
        local_58.s = SVar9;
        this = local_50;
        std::vector<haVoc::ScoredMove,_std::allocator<haVoc::ScoredMove>_>::
        emplace_back<haVoc::ScoredMove>(&local_50->m_moves,&local_58);
        iVar8 = moves->last;
      }
      lVar15 = lVar15 + 1;
      pUVar14 = pUVar14 + 3;
    } while (lVar15 < iVar8);
  }
  return;
}

Assistant:

void ScoredMoves::load_and_score(const position& p, Movegen* moves, const std::vector<Move>& filters, const Move& previous, const Move& followup, const Move& threat, node* stack, ScoreFunc score_lambda)
	{
		m_start = m_end = 0;
		for (int i = 0; i < moves->size(); ++i) {
			
			auto m = (*moves)[i];

			// skip hash moves and killers
			if (m == filters[0] || m == filters[1] || m == filters[2] ||
				m == filters[3] || m == filters[4])
				continue;

			Score sc = score_lambda(p, m, previous, followup, threat, stack);
			m_moves.emplace_back(ScoredMove(m, sc));
		}
	}